

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O0

void rec_call_setup(jit_State *J,BCReg func,ptrdiff_t nargs)

{
  int iVar1;
  TRef TVar2;
  uint *puVar3;
  long local_b8;
  ptrdiff_t i;
  TRef *fbase;
  TValue *pTStack_a0;
  TRef kfunc;
  TValue *functv;
  RecordIndex ix;
  ptrdiff_t nargs_local;
  BCReg func_local;
  jit_State *J_local;
  
  pTStack_a0 = J->L->base + func;
  puVar3 = J->base + func;
  ix._64_8_ = nargs;
  if (J->base[func] == 0) {
    sload(J,func);
  }
  for (local_b8 = 1; local_b8 <= (long)ix._64_8_; local_b8 = local_b8 + 1) {
    if (J->base[(ulong)(func + 1) + local_b8] == 0) {
      sload(J,func + 1 + (int)local_b8);
    }
  }
  if ((*puVar3 & 0x1f000000) != 0x8000000) {
    ix.oldv._0_4_ = *puVar3;
    functv = *(TValue **)pTStack_a0;
    iVar1 = lj_record_mm_lookup(J,(RecordIndex *)&functv,MM_call);
    if ((iVar1 == 0) || ((ix.val & 0x1f000000) != 0x8000000)) {
      lj_trace_err(J,LJ_TRERR_NOMM);
    }
    ix._64_8_ = ix._64_8_ + 1;
    for (local_b8 = ix._64_8_; 1 < local_b8; local_b8 = local_b8 + -1) {
      puVar3[local_b8 + 1] = puVar3[local_b8];
    }
    puVar3[2] = *puVar3;
    *puVar3 = ix.val;
    pTStack_a0 = &ix.valv;
  }
  TVar2 = rec_call_specialize(J,(GCfunc *)(pTStack_a0->u64 & 0x7fffffffffff),*puVar3);
  *puVar3 = TVar2;
  puVar3[1] = 0x10000;
  J->maxslot = ix.mobj;
  return;
}

Assistant:

static void rec_call_setup(jit_State *J, BCReg func, ptrdiff_t nargs)
{
  RecordIndex ix;
  TValue *functv = &J->L->base[func];
  TRef kfunc, *fbase = &J->base[func];
  ptrdiff_t i;
  (void)getslot(J, func); /* Ensure func has a reference. */
  for (i = 1; i <= nargs; i++)
    (void)getslot(J, func+LJ_FR2+i);  /* Ensure all args have a reference. */
  if (!tref_isfunc(fbase[0])) {  /* Resolve __call metamethod. */
    ix.tab = fbase[0];
    copyTV(J->L, &ix.tabv, functv);
    if (!lj_record_mm_lookup(J, &ix, MM_call) || !tref_isfunc(ix.mobj))
      lj_trace_err(J, LJ_TRERR_NOMM);
    for (i = ++nargs; i > LJ_FR2; i--)  /* Shift arguments up. */
      fbase[i+LJ_FR2] = fbase[i+LJ_FR2-1];
#if LJ_FR2
    fbase[2] = fbase[0];
#endif
    fbase[0] = ix.mobj;  /* Replace function. */
    functv = &ix.mobjv;
  }
  kfunc = rec_call_specialize(J, funcV(functv), fbase[0]);
#if LJ_FR2
  fbase[0] = kfunc;
  fbase[1] = TREF_FRAME;
#else
  fbase[0] = kfunc | TREF_FRAME;
#endif
  J->maxslot = (BCReg)nargs;
}